

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[21],char_const*,char[28],char_const*,char[61],char_const*>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [21],char **Args_1,
          char (*Args_2) [28],char **Args_3,char (*Args_4) [61],char **Args_5)

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[21],char_const*,char[28],char_const*,char[61],char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [21])this,(char **)Args,(char (*) [28])Args_1,(char **)Args_2,
             (char (*) [61])Args_3,(char **)Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}